

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O2

Vec_Ptr_t * Prs_ManReadBlif(char *pFileName)

{
  Vec_Str_t *p;
  Vec_Int_t *p_00;
  undefined1 *puVar1;
  int *piVar2;
  uint uVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  Prs_Man_t *p_01;
  FILE *__stream;
  long lVar8;
  char *pcVar9;
  Abc_Nam_t *pAVar10;
  Hash_IntMan_t *pHVar11;
  Vec_Ptr_t *pVVar12;
  void **ppvVar13;
  byte *pbVar14;
  Prs_Ntk_t *pPVar15;
  byte bVar16;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  undefined8 extraout_RDX;
  undefined8 uVar17;
  undefined8 extraout_RDX_00;
  long lVar18;
  ulong uVar19;
  Vec_Int_t *vVec1;
  long lVar20;
  int local_38;
  
  lVar20 = 1;
  p_01 = (Prs_Man_t *)calloc(1,0x4c0);
  if (pFileName != (char *)0x0) {
    __stream = fopen(pFileName,"rb");
    if (__stream == (FILE *)0x0) {
      puts("Cannot open input file.");
      return (Vec_Ptr_t *)0x0;
    }
    fseek(__stream,0,2);
    lVar8 = ftell(__stream);
    rewind(__stream);
    lVar18 = lVar8 << 0x20;
    pcVar9 = (char *)malloc(lVar18 + 0x1000000000 >> 0x20);
    *pcVar9 = '\n';
    local_38 = (int)lVar8;
    fread(pcVar9 + 1,(long)local_38,1,__stream);
    fclose(__stream);
    pcVar9[lVar18 + 0x100000000 >> 0x20] = '\n';
    pcVar9[lVar18 + 0x200000000 >> 0x20] = '\0';
    p_01->pName = pFileName;
    p_01->pBuffer = pcVar9;
    p_01->pLimit = pcVar9 + (long)local_38 + 3;
    p_01->pCur = pcVar9;
  }
  pAVar10 = Abc_NamStart(1000,0x18);
  p_01->pStrs = pAVar10;
  iVar6 = 100;
  pAVar10 = Abc_NamStart(100,0x18);
  p_01->pFuns = pAVar10;
  pHVar11 = Hash_IntManStart(iVar6);
  p_01->vHash = pHVar11;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 100;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(800);
  pVVar12->pArray = ppvVar13;
  p_01->vNtks = pVVar12;
  Abc_NamStrFindOrAdd(p_01->pFuns," 0\n",(int *)0x0);
  Abc_NamStrFindOrAdd(p_01->pFuns," 1\n",(int *)0x0);
  for (; lVar20 != 0xb; lVar20 = lVar20 + 1) {
    Abc_NamStrFindOrAdd(p_01->pStrs,s_BlifTypes[lVar20],(int *)0x0);
  }
  iVar6 = Abc_NamObjNumMax(p_01->pStrs);
  if (iVar6 != 0xb) {
    __assert_fail("Abc_NamObjNumMax(p->pStrs) == i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadBlif.c"
                  ,0x42,"void Prs_NtkAddBlifDirectives(Prs_Man_t *)");
  }
  p = &p_01->vCover;
  p_00 = &p_01->vTemp;
LAB_0033204f:
  do {
    while( true ) {
      pcVar9 = p_01->pCur;
      if (pcVar9[1] == '\0') goto LAB_0033267c;
      if (*pcVar9 != '\n') {
        __assert_fail("Prs_ManIsChar(p, \'\\n\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadBlif.c"
                      ,0x180,"int Prs_ManReadLines(Prs_Man_t *)");
      }
      p_01->pCur = pcVar9 + 1;
      Prs_ManSkipSpaces(p_01);
      pbVar14 = (byte *)p_01->pCur;
      bVar16 = *pbVar14;
      if (1 < bVar16 - 0x30) break;
LAB_003320b7:
      while ((bVar16 < 0x32 && ((0x3200000000000U >> ((ulong)bVar16 & 0x3f) & 1) != 0))) {
        p_01->pCur = (char *)(pbVar14 + 1);
        Vec_StrPush(p,*pbVar14);
        pbVar14 = (byte *)p_01->pCur;
        bVar16 = *pbVar14;
      }
      Prs_ManSkipSpaces(p_01);
      bVar16 = *p_01->pCur;
      if ((bVar16 - 0x30 < 2) || (bVar16 == 0x2d)) {
        Vec_StrPush(p,' ');
        pcVar9 = p_01->pCur;
        p_01->pCur = pcVar9 + 1;
        Vec_StrPush(p,*pcVar9);
        Vec_StrPush(p,'\n');
        Prs_ManSkipSpaces(p_01);
        if (*p_01->pCur != '\n') {
          pcVar9 = "Cannot read end of cube.";
          iVar6 = extraout_EDX_00;
          goto LAB_00332674;
        }
      }
      else {
        iVar6 = extraout_EDX;
        if (bVar16 != 10) {
          pcVar9 = "Cannot read output literal.";
          goto LAB_00332674;
        }
        if ((p_01->vCover).nSize != 1) {
          pcVar9 = "Cannot read cube.";
          goto LAB_00332674;
        }
        cVar5 = Vec_StrEntry(p,0);
        Vec_StrPush(p,cVar5);
        if ((p_01->vCover).nSize < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        *(p_01->vCover).pArray = ' ';
        Vec_StrPush(p,'\n');
      }
    }
  } while (bVar16 == 10);
  if (bVar16 != 0x2e) {
    if (bVar16 != 0x2d) {
      __assert_fail("Prs_ManIsLit(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadBlif.c"
                    ,0xc9,"int Prs_ManReadCube(Prs_Man_t *)");
    }
    goto LAB_003320b7;
  }
  iVar6 = (p_01->vCover).nSize;
  if (0 < iVar6) {
    if (iVar6 == 2) {
      cVar5 = Vec_StrEntryLast(p);
      bVar16 = 4;
      if (cVar5 != '0') {
        cVar5 = Vec_StrEntryLast(p);
        bVar16 = 8;
        if (cVar5 != '1') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadBlif.c"
                        ,0xe9,"void Prs_ManSaveCover(Prs_Man_t *)");
        }
      }
      puVar1 = &p_01->pNtk->field_0x4;
      *puVar1 = *puVar1 | bVar16;
      if ((p_01->vCover).nSize < 1) {
        __assert_fail("Vec_StrSize(&p->vCover) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadBlif.c"
                      ,0xeb,"void Prs_ManSaveCover(Prs_Man_t *)");
      }
    }
    Vec_StrPush(p,'\0');
    iVar6 = Abc_NamStrFindOrAdd(p_01->pFuns,(p_01->vCover).pArray,(int *)0x0);
    (p_01->vCover).nSize = 0;
    iVar7 = Prs_BoxNtk(p_01->pNtk,(p_01->pNtk->vObjs).nSize + -1);
    if (iVar7 != 1) {
      __assert_fail("Prs_BoxNtk(p->pNtk, Prs_NtkBoxNum(p->pNtk)-1) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadBlif.c"
                    ,0xf1,"void Prs_ManSaveCover(Prs_Man_t *)");
    }
    pPVar15 = p_01->pNtk;
    iVar7 = Vec_IntEntry(&pPVar15->vObjs,(pPVar15->vObjs).nSize + -1);
    Vec_IntWriteEntry(&pPVar15->vBoxes,iVar7 + 1,iVar6);
  }
  iVar7 = Prs_ManReadName(p_01);
  iVar6 = 0x7a6210;
  switch(iVar7) {
  case 1:
    if (p_01->pNtk != (Prs_Ntk_t *)0x0) {
      pcVar9 = "Parsing previous model is unfinished.";
      goto LAB_00332674;
    }
    iVar7 = Prs_ManReadName(p_01);
    iVar6 = extraout_EDX_01;
    if (iVar7 == 0) goto LAB_003325e0;
    if (p_01->pNtk != (Prs_Ntk_t *)0x0) {
      __assert_fail("p->pNtk == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaPrs.h"
                    ,0xd7,"void Prs_ManInitializeNtk(Prs_Man_t *, int, int)");
    }
    pPVar15 = (Prs_Ntk_t *)calloc(1,0xf0);
    p_01->pNtk = pPVar15;
    pPVar15->iModuleName = iVar7;
    pAVar10 = Abc_NamRef(p_01->pStrs);
    p_01->pNtk->pStrs = pAVar10;
    pAVar10 = Abc_NamRef(p_01->pFuns);
    pPVar15 = p_01->pNtk;
    pPVar15->pFuns = pAVar10;
    pHVar11 = p_01->vHash;
    piVar2 = &pHVar11->nRefs;
    *piVar2 = *piVar2 + 1;
    pPVar15->vHash = pHVar11;
    Vec_PtrPush(p_01->vNtks,pPVar15);
    Prs_ManSkipSpaces(p_01);
    if (*p_01->pCur != '\n') {
      pcVar9 = "Trailing symbols on .model line.";
      iVar6 = extraout_EDX_02;
      goto LAB_00332674;
    }
    goto LAB_0033204f;
  case 2:
    iVar6 = Prs_ManReadList(p_01,&p_01->pNtk->vOrder,3);
    if (iVar6 != 0) goto LAB_0033267c;
    vVec1 = &p_01->pNtk->vInouts;
    break;
  case 3:
    iVar6 = Prs_ManReadList(p_01,&p_01->pNtk->vOrder,1);
    if (iVar6 != 0) goto LAB_0033267c;
    vVec1 = &p_01->pNtk->vInputs;
    break;
  case 4:
    iVar6 = Prs_ManReadList(p_01,&p_01->pNtk->vOrder,2);
    if (iVar6 != 0) goto LAB_0033267c;
    vVec1 = &p_01->pNtk->vOutputs;
    break;
  case 5:
    (p_01->vTemp).nSize = 0;
    while (iVar6 = Prs_ManReadName(p_01), iVar6 != 0) {
      Vec_IntPush(p_00,0);
      Vec_IntPush(p_00,iVar6);
    }
    if ((p_01->vTemp).nSize == 0) {
      pcVar9 = "Signal list is empty.";
      iVar6 = extraout_EDX_03;
      goto LAB_00332674;
    }
    Prs_NtkAddBox(p_01->pNtk,1,0,p_00);
    goto LAB_0033204f;
  case 6:
    bVar4 = true;
    goto LAB_0033244b;
  case 7:
    bVar4 = false;
LAB_0033244b:
    iVar7 = Prs_ManReadName(p_01);
    iVar6 = (int)extraout_RDX;
    if (iVar7 == 0) {
LAB_003325e0:
      pcVar9 = "Cannot read model name.";
      goto LAB_00332674;
    }
    (p_01->vTemp).nSize = 0;
    uVar17 = extraout_RDX;
    while (iVar6 = (int)uVar17, *p_01->pCur != '\n') {
      iVar6 = Prs_ManReadName(p_01);
      if (iVar6 == 0) {
        pcVar9 = "Cannot read formal name.";
        iVar6 = extraout_EDX_07;
        goto LAB_00332674;
      }
      Vec_IntPush(p_00,iVar6);
      Prs_ManSkipSpaces(p_01);
      pcVar9 = p_01->pCur;
      p_01->pCur = pcVar9 + 1;
      if (*pcVar9 != '=') {
        pcVar9 = "Cannot find symbol \"=\".";
        iVar6 = extraout_EDX_08;
        goto LAB_00332674;
      }
      iVar6 = Prs_ManReadName(p_01);
      if (iVar6 == 0) {
        pcVar9 = "Cannot read actual name.";
        iVar6 = extraout_EDX_09;
        goto LAB_00332674;
      }
      Vec_IntPush(p_00,iVar6);
      Prs_ManSkipSpaces(p_01);
      uVar17 = extraout_RDX_00;
    }
    uVar3 = (p_01->vTemp).nSize;
    if (uVar3 == 0) {
      pcVar9 = "Cannot read a list of formal/actual names.";
      goto LAB_00332674;
    }
    if ((uVar3 & 1) != 0) {
      pcVar9 = "The number of formal/actual names is not even.";
      goto LAB_00332674;
    }
    Prs_NtkAddBox(p_01->pNtk,iVar7,0,p_00);
    if (!bVar4) {
      puVar1 = &p_01->pNtk->field_0x4;
      *puVar1 = *puVar1 | 1;
    }
    goto LAB_0033204f;
  case 8:
    iVar6 = Prs_ManReadName(p_01);
    (p_01->vTemp).nSize = 0;
    if (iVar6 == 0) {
      pcVar9 = "Cannot read latch input.";
      iVar6 = extraout_EDX_05;
    }
    else {
      Vec_IntWriteEntry(p_00,1,iVar6);
      iVar6 = Prs_ManReadName(p_01);
      if (iVar6 != 0) {
        cVar5 = '\0';
        Vec_IntWriteEntry(p_00,0,iVar6);
        Prs_ManSkipSpaces(p_01);
        iVar7 = (*p_01->pCur != '1') + 1;
        if (*p_01->pCur == '0') {
          iVar7 = 0;
        }
        Prs_ManSkipToChar(p_01,cVar5);
        pPVar15 = p_01->pNtk;
        iVar6 = -1;
        goto LAB_00332536;
      }
      pcVar9 = "Cannot read latch output.";
      iVar6 = extraout_EDX_06;
    }
    goto LAB_00332674;
  case 9:
    iVar6 = Prs_ManReadName(p_01);
    (p_01->vTemp).nSize = 0;
    if (iVar6 == 0) {
      pcVar9 = "Cannot read .short input.";
      iVar6 = extraout_EDX_10;
      goto LAB_00332674;
    }
    Vec_IntWriteEntry(p_00,1,iVar6);
    iVar6 = Prs_ManReadName(p_01);
    if (iVar6 == 0) {
      pcVar9 = "Cannot read .short output.";
      iVar6 = extraout_EDX_11;
      goto LAB_00332674;
    }
    Vec_IntWriteEntry(p_00,0,iVar6);
    Prs_ManSkipSpaces(p_01);
    if (*p_01->pCur != '\n') {
      pcVar9 = "Trailing symbols on .short line.";
      iVar6 = extraout_EDX_12;
      goto LAB_00332674;
    }
    iVar6 = Abc_NamStrFindOrAdd(p_01->pStrs,"1 1\n",(int *)0x0);
    pPVar15 = p_01->pNtk;
    iVar7 = 0;
LAB_00332536:
    Prs_NtkAddBox(pPVar15,iVar6,iVar7,p_00);
    goto LAB_0033204f;
  case 10:
    if (p_01->pNtk != (Prs_Ntk_t *)0x0) goto code_r0x0033232d;
    pcVar9 = "Directive .end without .model.";
    goto LAB_00332674;
  default:
    pcVar9 = Abc_NamStr(p_01->pStrs,iVar7);
    printf("Cannot read directive \"%s\".\n",pcVar9);
    goto LAB_0033267c;
  }
  Vec_IntAppend(vVec1,p_00);
  goto LAB_0033204f;
code_r0x0033232d:
  p_01->pNtk = (Prs_Ntk_t *)0x0;
  Prs_ManSkipSpaces(p_01);
  if (*p_01->pCur != '\n') {
    pcVar9 = "Trailing symbols on .end line.";
    iVar6 = extraout_EDX_04;
LAB_00332674:
    Prs_ManErrorSet(p_01,pcVar9,iVar6);
LAB_0033267c:
    if (p_01->ErrorStr[0] == '\0') {
      pVVar12 = p_01->vNtks;
      p_01->vNtks = (Vec_Ptr_t *)0x0;
    }
    else {
      uVar19 = 0;
      for (pcVar9 = p_01->pBuffer; pcVar9 < p_01->pCur; pcVar9 = pcVar9 + 1) {
        uVar19 = (ulong)((int)uVar19 + (uint)(*pcVar9 == '\n'));
      }
      pVVar12 = (Vec_Ptr_t *)0x0;
      printf("Line %d: %s\n",uVar19,p_01->ErrorStr);
    }
    if (p_01->pStrs != (Abc_Nam_t *)0x0) {
      Abc_NamDeref(p_01->pStrs);
    }
    if (p_01->pFuns != (Abc_Nam_t *)0x0) {
      Abc_NamDeref(p_01->pFuns);
    }
    if (p_01->vHash != (Hash_IntMan_t *)0x0) {
      Hash_IntManDeref(p_01->vHash);
    }
    if (p_01->vNtks != (Vec_Ptr_t *)0x0) {
      Prs_ManVecFree(p_01->vNtks);
    }
    pcVar9 = (p_01->vCover).pArray;
    if (pcVar9 != (char *)0x0) {
      free(pcVar9);
      (p_01->vCover).pArray = (char *)0x0;
    }
    (p_01->vCover).nCap = 0;
    (p_01->vCover).nSize = 0;
    Vec_IntErase(p_00);
    Vec_IntErase(&p_01->vTemp2);
    Vec_IntErase(&p_01->vTemp3);
    Vec_IntErase(&p_01->vTemp4);
    Vec_IntErase(&p_01->vKnown);
    Vec_IntErase(&p_01->vFailed);
    Vec_IntErase(&p_01->vSucceeded);
    free(p_01->pBuffer);
    free(p_01);
    return pVVar12;
  }
  goto LAB_0033204f;
}

Assistant:

Vec_Ptr_t * Prs_ManReadBlif( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Prs_Man_t * p = Prs_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Abc_NamStrFindOrAdd( p->pFuns, " 0\n", NULL );
    Abc_NamStrFindOrAdd( p->pFuns, " 1\n", NULL );
    Prs_NtkAddBlifDirectives( p );
    Prs_ManReadLines( p );
    if ( Prs_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Prs_ManFree( p );
    return vPrs;
}